

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.h
# Opt level: O2

Expression __thiscall cnn::RNNBuilder::add_input(RNNBuilder *this,Expression *x)

{
  uint uVar1;
  undefined8 extraout_RDX;
  Expression EVar2;
  
  RNNStateMachine::transition((RNNStateMachine *)&x->field_0xc,add_input);
  std::vector<cnn::RNNPointer,_std::allocator<cnn::RNNPointer>_>::push_back
            ((vector<cnn::RNNPointer,_std::allocator<cnn::RNNPointer>_> *)(x + 1),
             (value_type *)&x->i);
  uVar1 = (x->i).t;
  (x->i).t = (int)((ulong)(*(long *)&x[1].i - (long)x[1].pg) >> 2) - 1;
  (*(code *)x->pg[1].parameter_nodes.
            super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
            super__Vector_impl_data._M_finish)(this,x,uVar1);
  EVar2._8_8_ = extraout_RDX;
  EVar2.pg = (ComputationGraph *)this;
  return EVar2;
}

Assistant:

Expression add_input(const Expression& x) {
    sm.transition(RNNOp::add_input);
    head.push_back(cur);
    int rcp = cur;
    cur = head.size() - 1;
    return add_input_impl(rcp, x);
  }